

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

void __thiscall
glslang::HlslGrammar::acceptArraySpecifier(HlslGrammar *this,TArraySizes **arraySizes)

{
  bool bVar1;
  TArraySizes *this_00;
  size_t s;
  TArraySize pair;
  undefined1 local_50 [8];
  TArraySize arraySize;
  TIntermTyped *pTStack_38;
  bool hasArraySize;
  TIntermTyped *sizeExpr;
  TSourceLoc loc;
  TArraySizes **arraySizes_local;
  HlslGrammar *this_local;
  
  *arraySizes = (TArraySizes *)0x0;
  s = 0x165;
  loc._16_8_ = arraySizes;
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
  if (bVar1) {
    this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,s);
    TArraySizes::TArraySizes(this_00);
    *(TArraySizes **)loc._16_8_ = this_00;
    while (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket),
          bVar1) {
      sizeExpr = (TIntermTyped *)(this->super_HlslTokenStream).token.loc.name;
      loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
      loc.string = (this->super_HlslTokenStream).token.loc.column;
      loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      pTStack_38 = (TIntermTyped *)0x0;
      arraySize.node._7_1_ = acceptAssignmentExpression(this,&stack0xffffffffffffffc8);
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket);
      if (!bVar1) {
        expected(this,"]");
        return;
      }
      if ((arraySize.node._7_1_ & 1) == 0) {
        TArraySizes::addInnerSize(*(TArraySizes **)loc._16_8_,0);
      }
      else {
        HlslParseContext::arraySizeCheck
                  (this->parseContext,(TSourceLoc *)&sizeExpr,pTStack_38,(TArraySize *)local_50);
        pair._0_8_ = (ulong)local_50 & 0xffffffff;
        pair.node = (TIntermTyped *)arraySize._0_8_;
        TArraySizes::addInnerSize(*(TArraySizes **)loc._16_8_,pair);
      }
    }
  }
  return;
}

Assistant:

void HlslGrammar::acceptArraySpecifier(TArraySizes*& arraySizes)
{
    arraySizes = nullptr;

    // Early-out if there aren't any array dimensions
    if (!peekTokenClass(EHTokLeftBracket))
        return;

    // If we get here, we have at least one array dimension.  This will track the sizes we find.
    arraySizes = new TArraySizes;

    // Collect each array dimension.
    while (acceptTokenClass(EHTokLeftBracket)) {
        TSourceLoc loc = token.loc;
        TIntermTyped* sizeExpr = nullptr;

        // Array sizing expression is optional.  If omitted, array will be later sized by initializer list.
        const bool hasArraySize = acceptAssignmentExpression(sizeExpr);

        if (! acceptTokenClass(EHTokRightBracket)) {
            expected("]");
            return;
        }

        if (hasArraySize) {
            TArraySize arraySize;
            parseContext.arraySizeCheck(loc, sizeExpr, arraySize);
            arraySizes->addInnerSize(arraySize);
        } else {
            arraySizes->addInnerSize(0);  // sized by initializers.
        }
    }
}